

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multisetTest.cpp
# Opt level: O1

void relational_operator<ft::multiset<int,ft::less<int>,ft::allocator<int>>>
               (multiset<int,_ft::less<int>,_ft::allocator<int>_> *t1,char *s1,
               multiset<int,_ft::less<int>,_ft::allocator<int>_> *t2,char *s2)

{
  bool bVar1;
  size_t sVar2;
  
  if (s1 == (char *)0x0) {
    std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x10f0b8);
  }
  else {
    sVar2 = strlen(s1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,s1,sVar2);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," is...",6);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x48);
  std::ostream::put(-0x48);
  std::ostream::flush();
  bVar1 = ft::operator==(t1,t2);
  if (bVar1) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"equal to",8);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x48);
    std::ostream::put(-0x48);
    std::ostream::flush();
  }
  bVar1 = ft::operator==(t1,t2);
  if (!bVar1) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"not equal to",0xc);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x48);
    std::ostream::put(-0x48);
    std::ostream::flush();
  }
  bVar1 = ft::operator<(t1,t2);
  if (bVar1) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"smaller than",0xc);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x48);
    std::ostream::put(-0x48);
    std::ostream::flush();
  }
  bVar1 = ft::operator<(t2,t1);
  if (!bVar1) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"smaller than or equal to",0x18);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x48);
    std::ostream::put(-0x48);
    std::ostream::flush();
  }
  bVar1 = ft::operator<(t2,t1);
  if (bVar1) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"greater than",0xc);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x48);
    std::ostream::put(-0x48);
    std::ostream::flush();
  }
  bVar1 = ft::operator<(t1,t2);
  if (!bVar1) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"greater than or equal to",0x18);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x48);
    std::ostream::put(-0x48);
    std::ostream::flush();
  }
  if (s2 == (char *)0x0) {
    std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x10f0b8);
  }
  else {
    sVar2 = strlen(s2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,s2,sVar2);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"!\n",2);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x48);
  std::ostream::put(-0x48);
  std::ostream::flush();
  return;
}

Assistant:

void 	relational_operator(T const & t1, char const * s1, T const & t2, char const * s2) {
	std::cout << s1 << " is..." << std::endl;

	if (t1 == t2) std::cout << "equal to" << std::endl;
	if (t1 != t2) std::cout << "not equal to" << std::endl;
	if (t1 < t2) std::cout << "smaller than" << std::endl;
	if (t1 <= t2) std::cout << "smaller than or equal to" << std::endl;
	if (t1 > t2) std::cout << "greater than" << std::endl;
	if (t1 >= t2) std::cout << "greater than or equal to" << std::endl;

	std::cout << s2 << "!\n" << std::endl;
}